

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.h
# Opt level: O0

void __thiscall
crnlib::dxt_hc::color_cluster::color_cluster(color_cluster *this,color_cluster *param_2)

{
  long in_RSI;
  long in_RDI;
  vector<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffff68;
  vector<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffff70;
  undefined8 local_58;
  undefined8 local_28;
  
  local_28 = 0;
  do {
    vector<unsigned_int>::vector
              ((vector<unsigned_int> *)in_stack_ffffffffffffff70,
               (vector<unsigned_int> *)in_stack_ffffffffffffff68);
    local_28 = local_28 + 1;
  } while (local_28 != 3);
  vector<crnlib::color_quad<unsigned_char,_int>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  local_58 = 0;
  do {
    color_quad<unsigned_char,_int>::color_quad
              ((color_quad<unsigned_char,_int> *)(in_RDI + 0x48 + local_58 * 4),
               (color_quad<unsigned_char,_int> *)(in_RSI + 0x48 + local_58 * 4));
    local_58 = local_58 + 1;
  } while (local_58 != 4);
  return;
}

Assistant:

color_cluster() : first_endpoint(0), second_endpoint(0) {}